

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall cmTarget::GetSafeProperty(cmTarget *this,string *prop)

{
  int iVar1;
  string *psVar2;
  
  psVar2 = (string *)GetProperty(this,prop);
  if ((psVar2 == (string *)0x0) &&
     (psVar2 = &GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_,
     GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_ == '\0')) {
    iVar1 = __cxa_guard_acquire(&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_);
    if (iVar1 != 0) {
      GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_.field_2;
      psVar2 = &GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_;
      GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_._M_string_length = 0;
      GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_);
    }
  }
  return psVar2;
}

Assistant:

std::string const& cmTarget::GetSafeProperty(std::string const& prop) const
{
  cmValue ret = this->GetProperty(prop);
  if (ret) {
    return *ret;
  }

  static std::string const s_empty;
  return s_empty;
}